

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmFuncts.cpp
# Opt level: O3

int AsmFuncts::getType(string *op)

{
  size_t sVar1;
  int iVar2;
  int in_ECX;
  long lVar3;
  size_type *psVar4;
  bool bVar5;
  string local_48;
  
  Conversion::decToBin_abi_cxx11_(&local_48,(Conversion *)0x0,6,in_ECX);
  sVar1 = op->_M_string_length;
  if (sVar1 == local_48._M_string_length) {
    if (sVar1 == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp((op->_M_dataplus)._M_p,local_48._M_dataplus._M_p,sVar1);
      bVar5 = iVar2 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  iVar2 = 1;
  if (!bVar5) {
    if ((long)Codes::typeROp_abi_cxx11_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)Codes::typeROp_abi_cxx11_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar3 = (long)Codes::typeROp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)Codes::typeROp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      sVar1 = op->_M_string_length;
      lVar3 = lVar3 + (ulong)(lVar3 == 0);
      psVar4 = &((Codes::typeROp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._M_string_length;
      do {
        if (sVar1 == *psVar4) {
          if (sVar1 == 0) {
            return 1;
          }
          iVar2 = bcmp((op->_M_dataplus)._M_p,
                       (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (psVar4 + -1))->_M_dataplus)._M_p,sVar1);
          if (iVar2 == 0) {
            return 1;
          }
        }
        psVar4 = psVar4 + 8;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    if ((long)Codes::typeIOp_abi_cxx11_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)Codes::typeIOp_abi_cxx11_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar3 = (long)Codes::typeIOp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)Codes::typeIOp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      sVar1 = op->_M_string_length;
      lVar3 = lVar3 + (ulong)(lVar3 == 0);
      psVar4 = &((Codes::typeIOp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second)._M_string_length;
      do {
        if (sVar1 == psVar4[-4]) {
          if (sVar1 == 0) {
            return 2;
          }
          iVar2 = bcmp((op->_M_dataplus)._M_p,(void *)psVar4[-5],sVar1);
          if (iVar2 == 0) {
            return 2;
          }
          if (sVar1 == *psVar4) {
LAB_00125b12:
            iVar2 = bcmp((op->_M_dataplus)._M_p,
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (psVar4 + -1))->_M_dataplus)._M_p,sVar1);
            if (iVar2 == 0) {
              return 2;
            }
          }
        }
        else if (sVar1 == *psVar4) {
          if (sVar1 == 0) {
            return 2;
          }
          goto LAB_00125b12;
        }
        psVar4 = psVar4 + 8;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    if ((long)Codes::typeJOp_abi_cxx11_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)Codes::typeJOp_abi_cxx11_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar3 = (long)Codes::typeJOp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)Codes::typeJOp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      sVar1 = op->_M_string_length;
      lVar3 = lVar3 + (ulong)(lVar3 == 0);
      psVar4 = &((Codes::typeJOp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second)._M_string_length;
      do {
        if (sVar1 == psVar4[-4]) {
          if (sVar1 == 0) {
            return 3;
          }
          iVar2 = bcmp((op->_M_dataplus)._M_p,(void *)psVar4[-5],sVar1);
          if (iVar2 == 0) {
            return 3;
          }
          if (sVar1 == *psVar4) {
LAB_00125b95:
            iVar2 = bcmp((op->_M_dataplus)._M_p,
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (psVar4 + -1))->_M_dataplus)._M_p,sVar1);
            if (iVar2 == 0) {
              return 3;
            }
          }
        }
        else if (sVar1 == *psVar4) {
          if (sVar1 == 0) {
            return 3;
          }
          goto LAB_00125b95;
        }
        psVar4 = psVar4 + 8;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int AsmFuncts::getType(string op){
    if(op == Conversion::decToBin(0,6))
        return TYPE_R;
    for (int i = 0; i < Codes::typeROp.size(); i++)
        if((op == Codes::typeROp[i].first))
            return TYPE_R;

    for (int i = 0; i < Codes::typeIOp.size(); i++)
        if((op == Codes::typeIOp[i].first) || (op == Codes::typeIOp[i].second))
            return TYPE_I;

    for (int i = 0; i < Codes::typeJOp.size(); i++)
        if((op == Codes::typeJOp[i].first) || (op == Codes::typeJOp[i].second))
            return TYPE_J;
    return -1;
}